

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifLibLut.c
# Opt level: O2

If_LibLut_t * If_LibLutReadString(char *pStr)

{
  char *pcVar1;
  float fVar2;
  int iVar3;
  bool bVar4;
  char cVar5;
  uint uVar6;
  Vec_Ptr_t *p;
  void **ppvVar7;
  char *__ptr;
  If_LibLut_t *__ptr_00;
  float (*pafVar8) [33];
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  char *pcVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  double dVar16;
  
  if ((pStr == (char *)0x0) || (*pStr == '\0')) {
    __ptr_00 = (If_LibLut_t *)0x0;
  }
  else {
    p = (Vec_Ptr_t *)malloc(0x10);
    p->nCap = 1000;
    p->nSize = 0;
    ppvVar7 = (void **)malloc(8000);
    p->pArray = ppvVar7;
    __ptr = Abc_UtilStrsav(pStr);
    cVar5 = *__ptr;
    pcVar12 = __ptr;
    while (cVar5 != '\0') {
      iVar3 = p->nSize;
      if (iVar3 == p->nCap) {
        uVar14 = iVar3 * 2;
        if (iVar3 < 0x10) {
          uVar14 = 0x10;
        }
        ppvVar7 = p->pArray;
        if (iVar3 < (int)uVar14) {
          if (ppvVar7 == (void **)0x0) {
            ppvVar7 = (void **)malloc((ulong)uVar14 << 3);
          }
          else {
            ppvVar7 = (void **)realloc(ppvVar7,(ulong)uVar14 << 3);
          }
          p->pArray = ppvVar7;
          p->nCap = uVar14;
        }
      }
      else {
        ppvVar7 = p->pArray;
      }
      p->nSize = iVar3 + 1;
      ppvVar7[iVar3] = pcVar12;
      pcVar12 = pcVar12 + -1;
      do {
        pcVar1 = pcVar12 + 1;
        pcVar12 = pcVar12 + 1;
      } while (*pcVar1 != '\n');
      cVar5 = '\n';
      while (cVar5 == '\n') {
        *pcVar12 = '\0';
        pcVar1 = pcVar12 + 1;
        pcVar12 = pcVar12 + 1;
        cVar5 = *pcVar1;
      }
    }
    uVar10 = 1;
    __ptr_00 = (If_LibLut_t *)calloc(1,0x1198);
    bVar4 = false;
    uVar14 = p->nSize;
    if (p->nSize < 1) {
      uVar14 = 0;
    }
    uVar11 = 1;
    for (uVar9 = 0; lVar15 = (long)(int)uVar11, uVar9 != uVar14; uVar9 = uVar9 + 1) {
      if (((*p->pArray[uVar9] != '\0') &&
          (pcVar12 = strtok((char *)p->pArray[uVar9]," \t\n"), pcVar12 != (char *)0x0)) &&
         (*pcVar12 != '#')) {
        uVar6 = atoi(pcVar12);
        if (uVar11 == uVar6) {
          pcVar12 = strtok((char *)0x0," \t\n");
          dVar16 = atof(pcVar12);
          __ptr_00->pLutAreas[lVar15] = (float)dVar16;
          uVar13 = 0;
          while (pcVar12 = strtok((char *)0x0," \t\n"), pcVar12 != (char *)0x0) {
            dVar16 = atof(pcVar12);
            __ptr_00->pLutDelays[lVar15][uVar13] = (float)dVar16;
            uVar13 = uVar13 + 1;
          }
          if ((int)uVar11 < (int)uVar13) {
            Abc_Print(1,"LUT %d has too many pins (%d). Max allowed is %d.\n",(ulong)uVar11,
                      uVar13 & 0xffffffff,(ulong)uVar11);
          }
          else {
            if (1 < uVar13) {
              __ptr_00->fVarPinDelays = 1;
              bVar4 = true;
            }
            if (uVar11 != 0x20) {
              uVar11 = uVar11 + 1;
              goto LAB_0038e4a2;
            }
            Abc_Print(1,"Skipping LUTs of size more than %d.\n",0x20);
          }
        }
        else {
          Abc_Print(1,"Error in the LUT library string.\n");
        }
        free(__ptr_00);
        __ptr_00 = (If_LibLut_t *)0x0;
        goto LAB_0038e619;
      }
LAB_0038e4a2:
    }
    __ptr_00->LutMax = uVar11 - 1;
    if (bVar4) {
      pafVar8 = __ptr_00->pLutDelays;
      for (; pafVar8 = pafVar8 + 1, (long)uVar10 < lVar15; uVar10 = uVar10 + 1) {
        for (uVar9 = 0; uVar10 != uVar9; uVar9 = uVar9 + 1) {
          fVar2 = (*pafVar8)[uVar9];
          if (fVar2 <= 0.0) {
            Abc_Print(0,
                      "Pin %d of LUT %d has delay %f. Pin delays should be non-negative numbers. Technology mapping may not work correctly.\n"
                      ,(double)fVar2,uVar9 & 0xffffffff,uVar10 & 0xffffffff);
          }
          if ((uVar9 != 0) && (fVar2 < pafVar8[-1][uVar9 + 0x20])) {
            Abc_Print(0,
                      "Pin %d of LUT %d has delay %f. Pin %d of LUT %d has delay %f. Pin delays should be in non-decreasing order. Technology mapping may not work correctly.\n"
                      ,(double)pafVar8[-1][uVar9 + 0x20],(double)fVar2,(ulong)((int)uVar9 - 1),
                      uVar10 & 0xffffffff,uVar9 & 0xffffffff,uVar10 & 0xffffffff);
          }
        }
      }
    }
    else {
      pafVar8 = __ptr_00->pLutDelays;
      for (uVar10 = 1; pafVar8 = pafVar8 + 1, (long)uVar10 < lVar15; uVar10 = uVar10 + 1) {
        if ((*pafVar8)[0] <= 0.0) {
          Abc_Print(0,
                    "LUT %d has delay %f. Pin delays should be non-negative numbers. Technology mapping may not work correctly.\n"
                    ,(double)(*pafVar8)[0],uVar10 & 0xffffffff);
        }
      }
    }
LAB_0038e619:
    free(__ptr);
    Vec_PtrFree(p);
  }
  return __ptr_00;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Reads the description of LUTs from the LUT library file.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
If_LibLut_t * If_LibLutReadString( char * pStr )
{
    If_LibLut_t * p;
    Vec_Ptr_t * vStrs;
    char * pToken, * pBuffer, * pStrNew, * pStrMem;
    int i, k, j;

    if ( pStr == NULL || pStr[0] == 0 )
        return NULL;

    vStrs = Vec_PtrAlloc( 1000 );
    pStrNew = pStrMem = Abc_UtilStrsav( pStr );
    while ( *pStrNew )
    {
        Vec_PtrPush( vStrs, pStrNew );
        while ( *pStrNew != '\n' )
            pStrNew++;
        while ( *pStrNew == '\n' )
            *pStrNew++ = '\0';
    }

    p = ABC_ALLOC( If_LibLut_t, 1 );
    memset( p, 0, sizeof(If_LibLut_t) );

    i = 1;
    //while ( fgets( pBuffer, 1000, pFile ) != NULL )
    Vec_PtrForEachEntry( char *, vStrs, pBuffer, j )
    {
        if ( pBuffer[0] == 0 )
            continue;
        pToken = strtok( pBuffer, " \t\n" );
        if ( pToken == NULL )
            continue;
        if ( pToken[0] == '#' )
            continue;
        if ( i != atoi(pToken) )
        {
            Abc_Print( 1, "Error in the LUT library string.\n" );
            ABC_FREE( p->pName );
            ABC_FREE( p );
            ABC_FREE( pStrMem );
            Vec_PtrFree( vStrs );
            return NULL;
        }

        // read area
        pToken = strtok( NULL, " \t\n" );
        p->pLutAreas[i] = (float)atof(pToken);

        // read delays
        k = 0;
        while ( (pToken = strtok( NULL, " \t\n" )) )
            p->pLutDelays[i][k++] = (float)atof(pToken);

        // check for out-of-bound
        if ( k > i )
        {
            Abc_Print( 1, "LUT %d has too many pins (%d). Max allowed is %d.\n", i, k, i );
            ABC_FREE( p->pName );
            ABC_FREE( p );
            ABC_FREE( pStrMem );
            Vec_PtrFree( vStrs );
            return NULL;
        }

        // check if var delays are specified
        if ( k > 1 )
            p->fVarPinDelays = 1;

        if ( i == IF_MAX_LUTSIZE )
        {
            Abc_Print( 1, "Skipping LUTs of size more than %d.\n", i );
            ABC_FREE( p->pName );
            ABC_FREE( p );
            ABC_FREE( pStrMem );
            Vec_PtrFree( vStrs );
            return NULL;
        }
        i++;
    }
    p->LutMax = i-1;

    // check the library
    if ( p->fVarPinDelays )
    {
        for ( i = 1; i <= p->LutMax; i++ )
            for ( k = 0; k < i; k++ )
            {
                if ( p->pLutDelays[i][k] <= 0.0 )
                    Abc_Print( 0, "Pin %d of LUT %d has delay %f. Pin delays should be non-negative numbers. Technology mapping may not work correctly.\n", 
                        k, i, p->pLutDelays[i][k] );
                if ( k && p->pLutDelays[i][k-1] > p->pLutDelays[i][k] )
                    Abc_Print( 0, "Pin %d of LUT %d has delay %f. Pin %d of LUT %d has delay %f. Pin delays should be in non-decreasing order. Technology mapping may not work correctly.\n", 
                        k-1, i, p->pLutDelays[i][k-1], 
                        k, i, p->pLutDelays[i][k] );
            }
    }
    else
    {
        for ( i = 1; i <= p->LutMax; i++ )
        {
            if ( p->pLutDelays[i][0] <= 0.0 )
                Abc_Print( 0, "LUT %d has delay %f. Pin delays should be non-negative numbers. Technology mapping may not work correctly.\n", 
                    i, p->pLutDelays[i][0] );
        }
    }

    // cleanup
    ABC_FREE( pStrMem );
    Vec_PtrFree( vStrs );
    return p;
}